

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenubar.cpp
# Opt level: O2

void __thiscall QDBusMenuBar::~QDBusMenuBar(QDBusMenuBar *this)

{
  *(undefined ***)this = &PTR_metaObject_0078cc48;
  unregisterMenuBar(this);
  if (*(long **)(this + 0x18) != (long *)0x0) {
    (**(code **)(**(long **)(this + 0x18) + 0x20))();
  }
  if (*(long **)(this + 0x10) != (long *)0x0) {
    (**(code **)(**(long **)(this + 0x10) + 0x20))();
  }
  qDeleteAll<QHash<unsigned_long_long,QDBusPlatformMenuItem*>>
            ((QHash<unsigned_long_long,_QDBusPlatformMenuItem_*> *)(this + 0x20));
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)(this + 0x38));
  QWeakPointer<QObject>::~QWeakPointer((QWeakPointer<QObject> *)(this + 0x28));
  QHash<unsigned_long_long,_QDBusPlatformMenuItem_*>::~QHash
            ((QHash<unsigned_long_long,_QDBusPlatformMenuItem_*> *)(this + 0x20));
  QObject::~QObject((QObject *)this);
  return;
}

Assistant:

QDBusMenuBar::~QDBusMenuBar()
{
    unregisterMenuBar();
    delete m_menuAdaptor;
    delete m_menu;
    qDeleteAll(m_menuItems);
}